

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.cpp
# Opt level: O1

Action __thiscall
psy::C::DeclarationBinder::visitCompoundStatement
          (DeclarationBinder *this,CompoundStatementSyntax *node)

{
  Action AVar1;
  StatementListSyntax *pSVar2;
  
  pushNewScope(this,(SyntaxNode *)node,Block,true);
  pSVar2 = node->stmts_;
  while( true ) {
    if (pSVar2 == (StatementListSyntax *)0x0) {
      std::deque<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>::pop_back(&(this->scopes_).c);
      return Skip;
    }
    AVar1 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pSVar2->
                         super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                         ).
                         super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar1 == Quit) break;
    pSVar2 = (pSVar2->
             super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
             ).
             super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
             .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitCompoundStatement(const CompoundStatementSyntax* node)
{
    pushNewScope(node, ScopeKind::Block, true);
    VISIT(node->statements());
    popScope();

    return Action::Skip;
}